

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall
Catch::JunitReporter::writeSection
          (JunitReporter *this,string *className,string *rootName,SectionNode *sectionNode)

{
  SectionInfo *pSVar1;
  XmlWriter *this_00;
  string *psVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  pointer pcVar5;
  pointer pAVar6;
  pointer pPVar7;
  undefined *puVar8;
  long lVar9;
  long *plVar10;
  size_type *psVar11;
  pointer pPVar12;
  char *this_01;
  pointer stats;
  char *__end;
  ScopedElement scoped;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  ScopedElement e;
  string name;
  string local_b0;
  ScopedElement local_90;
  string local_88;
  string *local_68;
  JunitReporter *local_60;
  ScopedElement local_58;
  string local_50;
  
  puVar8 = trim(std::__cxx11::string_const&)::whitespaceChars;
  pSVar1 = &(sectionNode->stats).sectionInfo;
  local_68 = className;
  local_60 = this;
  strlen(trim(std::__cxx11::string_const&)::whitespaceChars);
  lVar9 = std::__cxx11::string::find_first_not_of((char *)pSVar1,(ulong)puVar8,0);
  puVar8 = trim(std::__cxx11::string_const&)::whitespaceChars;
  strlen(trim(std::__cxx11::string_const&)::whitespaceChars);
  std::__cxx11::string::find_last_not_of((char *)pSVar1,(ulong)puVar8,0xffffffffffffffff);
  if (lVar9 == -1) {
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    local_50._M_string_length = 0;
    local_50.field_2._M_local_buf[0] = '\0';
  }
  else {
    std::__cxx11::string::substr((ulong)&local_50,(ulong)pSVar1);
  }
  if (rootName->_M_string_length != 0) {
    pcVar5 = (rootName->_M_dataplus)._M_p;
    local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_88,pcVar5,pcVar5 + rootName->_M_string_length);
    std::__cxx11::string::append((char *)&local_88);
    plVar10 = (long *)std::__cxx11::string::_M_append
                                ((char *)&local_88,(ulong)local_50._M_dataplus._M_p);
    psVar11 = (size_type *)(plVar10 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar10 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar11) {
      local_b0.field_2._M_allocated_capacity = *psVar11;
      local_b0.field_2._8_8_ = plVar10[3];
      local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    }
    else {
      local_b0.field_2._M_allocated_capacity = *psVar11;
      local_b0._M_dataplus._M_p = (pointer)*plVar10;
    }
    local_b0._M_string_length = plVar10[1];
    *plVar10 = (long)psVar11;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
    std::__cxx11::string::operator=((string *)&local_50,(string *)&local_b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != &local_88.field_2) {
      operator_delete(local_88._M_dataplus._M_p);
    }
  }
  if ((((sectionNode->assertions).
        super__Vector_base<Catch::AssertionStats,_std::allocator<Catch::AssertionStats>_>._M_impl.
        super__Vector_impl_data._M_start !=
        (sectionNode->assertions).
        super__Vector_base<Catch::AssertionStats,_std::allocator<Catch::AssertionStats>_>._M_impl.
        super__Vector_impl_data._M_finish) || ((sectionNode->stdOut)._M_string_length != 0)) ||
     ((sectionNode->stdErr)._M_string_length != 0)) {
    paVar3 = &local_b0.field_2;
    local_b0._M_dataplus._M_p = (pointer)paVar3;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"testcase","");
    this_00 = &local_60->xml;
    local_58.m_writer = this_00;
    XmlWriter::startElement(this_00,&local_b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != paVar3) {
      operator_delete(local_b0._M_dataplus._M_p);
    }
    if (local_68->_M_string_length == 0) {
      local_b0._M_dataplus._M_p = (pointer)paVar3;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"classname","");
      XmlWriter::writeAttribute(this_00,&local_b0,&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != paVar3) {
        operator_delete(local_b0._M_dataplus._M_p);
      }
      local_b0._M_dataplus._M_p = (pointer)paVar3;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"name","");
      XmlWriter::writeAttribute<char[5]>(this_00,&local_b0,(char (*) [5])"root");
    }
    else {
      local_b0._M_dataplus._M_p = (pointer)paVar3;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"classname","");
      XmlWriter::writeAttribute(this_00,&local_b0,local_68);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != paVar3) {
        operator_delete(local_b0._M_dataplus._M_p);
      }
      local_b0._M_dataplus._M_p = (pointer)paVar3;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"name","");
      XmlWriter::writeAttribute(this_00,&local_b0,&local_50);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != paVar3) {
      operator_delete(local_b0._M_dataplus._M_p);
    }
    this_01 = "time";
    local_b0._M_dataplus._M_p = (pointer)paVar3;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"time","");
    toString_abi_cxx11_(&local_88,(Catch *)this_01,(sectionNode->stats).durationInSeconds);
    XmlWriter::writeAttribute(this_00,&local_b0,&local_88);
    paVar4 = &local_88.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != paVar4) {
      operator_delete(local_88._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != paVar3) {
      operator_delete(local_b0._M_dataplus._M_p);
    }
    pAVar6 = (sectionNode->assertions).
             super__Vector_base<Catch::AssertionStats,_std::allocator<Catch::AssertionStats>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    for (stats = (sectionNode->assertions).
                 super__Vector_base<Catch::AssertionStats,_std::allocator<Catch::AssertionStats>_>.
                 _M_impl.super__Vector_impl_data._M_start; stats != pAVar6; stats = stats + 1) {
      writeAssertion(local_60,stats);
    }
    if ((sectionNode->stdOut)._M_string_length != 0) {
      local_b0._M_dataplus._M_p = (pointer)paVar3;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"system-out","");
      local_90.m_writer = this_00;
      XmlWriter::startElement(this_00,&local_b0);
      puVar8 = trim(std::__cxx11::string_const&)::whitespaceChars;
      psVar2 = &sectionNode->stdOut;
      strlen(trim(std::__cxx11::string_const&)::whitespaceChars);
      lVar9 = std::__cxx11::string::find_first_not_of((char *)psVar2,(ulong)puVar8,0);
      puVar8 = trim(std::__cxx11::string_const&)::whitespaceChars;
      strlen(trim(std::__cxx11::string_const&)::whitespaceChars);
      std::__cxx11::string::find_last_not_of((char *)psVar2,(ulong)puVar8,0xffffffffffffffff);
      if (lVar9 == -1) {
        local_88._M_string_length = 0;
        local_88.field_2._M_local_buf[0] = '\0';
        local_88._M_dataplus._M_p = (pointer)paVar4;
      }
      else {
        std::__cxx11::string::substr((ulong)&local_88,(ulong)psVar2);
      }
      XmlWriter::writeText(local_90.m_writer,&local_88,false);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88._M_dataplus._M_p != paVar4) {
        operator_delete(local_88._M_dataplus._M_p);
      }
      XmlWriter::ScopedElement::~ScopedElement(&local_90);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
        operator_delete(local_b0._M_dataplus._M_p);
      }
    }
    if ((sectionNode->stdErr)._M_string_length != 0) {
      local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"system-err","");
      local_90.m_writer = this_00;
      XmlWriter::startElement(this_00,&local_b0);
      puVar8 = trim(std::__cxx11::string_const&)::whitespaceChars;
      psVar2 = &sectionNode->stdErr;
      strlen(trim(std::__cxx11::string_const&)::whitespaceChars);
      lVar9 = std::__cxx11::string::find_first_not_of((char *)psVar2,(ulong)puVar8,0);
      puVar8 = trim(std::__cxx11::string_const&)::whitespaceChars;
      strlen(trim(std::__cxx11::string_const&)::whitespaceChars);
      std::__cxx11::string::find_last_not_of((char *)psVar2,(ulong)puVar8,0xffffffffffffffff);
      if (lVar9 == -1) {
        local_88._M_string_length = 0;
        local_88.field_2._M_local_buf[0] = '\0';
        local_88._M_dataplus._M_p = (pointer)paVar4;
      }
      else {
        std::__cxx11::string::substr((ulong)&local_88,(ulong)psVar2);
      }
      XmlWriter::writeText(local_90.m_writer,&local_88,false);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88._M_dataplus._M_p != paVar4) {
        operator_delete(local_88._M_dataplus._M_p);
      }
      XmlWriter::ScopedElement::~ScopedElement(&local_90);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
        operator_delete(local_b0._M_dataplus._M_p);
      }
    }
    XmlWriter::ScopedElement::~ScopedElement(&local_58);
  }
  pPVar12 = (sectionNode->childSections).
            super__Vector_base<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>,_std::allocator<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pPVar7 = (sectionNode->childSections).
           super__Vector_base<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>,_std::allocator<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pPVar12 != pPVar7) {
    do {
      if (local_68->_M_string_length == 0) {
        local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"","");
        writeSection(local_60,&local_50,&local_b0,pPVar12->m_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
          operator_delete(local_b0._M_dataplus._M_p);
        }
      }
      else {
        writeSection(local_60,local_68,&local_50,pPVar12->m_p);
      }
      pPVar12 = pPVar12 + 1;
    } while (pPVar12 != pPVar7);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  return;
}

Assistant:

void writeSection(  std::string const& className,
                            std::string const& rootName,
                            SectionNode const& sectionNode ) {
            std::string name = trim( sectionNode.stats.sectionInfo.name );
            if( !rootName.empty() )
                name = rootName + "/" + name;

            if( !sectionNode.assertions.empty() ||
                !sectionNode.stdOut.empty() ||
                !sectionNode.stdErr.empty() ) {
                XmlWriter::ScopedElement e = xml.scopedElement( "testcase" );
                if( className.empty() ) {
                    xml.writeAttribute( "classname", name );
                    xml.writeAttribute( "name", "root" );
                }
                else {
                    xml.writeAttribute( "classname", className );
                    xml.writeAttribute( "name", name );
                }
                xml.writeAttribute( "time", toString( sectionNode.stats.durationInSeconds ) );

                writeAssertions( sectionNode );

                if( !sectionNode.stdOut.empty() )
                    xml.scopedElement( "system-out" ).writeText( trim( sectionNode.stdOut ), false );
                if( !sectionNode.stdErr.empty() )
                    xml.scopedElement( "system-err" ).writeText( trim( sectionNode.stdErr ), false );
            }
            for( SectionNode::ChildSections::const_iterator
                    it = sectionNode.childSections.begin(),
                    itEnd = sectionNode.childSections.end();
                    it != itEnd;
                    ++it )
                if( className.empty() )
                    writeSection( name, "", **it );
                else
                    writeSection( className, name, **it );
        }